

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O1

bool __thiscall xLearn::Checker::check_prediction_param(Checker *this,HyperParam *hyper_param)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  Checker *this_00;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  undefined1 local_40 [32];
  
  if (hyper_param->from_file == true) {
    bVar3 = FileExist((hyper_param->test_set_file)._M_dataplus._M_p);
    bVar2 = true;
    if (bVar3) goto LAB_00152963;
    StringPrintf_abi_cxx11_
              ((string *)local_40,"Test set file: %s does not exist.",
               (hyper_param->test_set_file)._M_dataplus._M_p);
    local_44.code = FG_RED;
    local_48.code = BOLD;
    local_4c.code = RESET;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_40._0_8_,local_40._8_8_);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    bVar2 = true;
    if (hyper_param->test_dataset != (DMatrix *)0x0) goto LAB_00152963;
    StringPrintf_abi_cxx11_((string *)local_40,"Test dataset is None, please check!");
    local_44.code = FG_RED;
    local_48.code = BOLD;
    local_4c.code = RESET;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_40._0_8_,local_40._8_8_);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((Checker *)local_40._0_8_ != (Checker *)(local_40 + 0x10)) {
    operator_delete((void *)local_40._0_8_);
  }
  bVar2 = false;
LAB_00152963:
  this_00 = (Checker *)(hyper_param->model_file)._M_dataplus._M_p;
  bVar3 = FileExist((char *)this_00);
  if (!bVar3) {
    StringPrintf_abi_cxx11_
              ((string *)local_40,"Model file: %s does not exist.",
               (hyper_param->model_file)._M_dataplus._M_p);
    local_44.code = FG_RED;
    local_48.code = BOLD;
    local_4c.code = RESET;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_40._0_8_,local_40._8_8_);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    this_00 = (Checker *)local_40._0_8_;
    if ((Checker *)local_40._0_8_ != (Checker *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    bVar2 = false;
  }
  if (hyper_param->thread_number < 0) {
    StringPrintf_abi_cxx11_((string *)local_40,"The thread number must be greater than zero: %d.");
    local_44.code = FG_RED;
    local_48.code = BOLD;
    local_4c.code = RESET;
    poVar4 = Color::operator<<((ostream *)&std::cout,&local_44);
    poVar4 = Color::operator<<(poVar4,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ ERROR      ] ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_40._0_8_,local_40._8_8_);
    poVar4 = Color::operator<<(poVar4,&local_4c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((Checker *)local_40._0_8_ != (Checker *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    bVar2 = false;
    this_00 = (Checker *)local_40._0_8_;
  }
  if (bVar2) {
    check_conflict_predict(this_00,hyper_param);
    if ((hyper_param->res_out == true) && ((hyper_param->output_file)._M_string_length == 0)) {
      pcVar1 = (hyper_param->test_set_file)._M_dataplus._M_p;
      local_40._0_8_ = local_40 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar1,pcVar1 + (hyper_param->test_set_file)._M_string_length);
      std::__cxx11::string::append((char *)local_40);
      std::__cxx11::string::operator=((string *)&hyper_param->output_file,(string *)local_40);
      if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
        operator_delete((void *)local_40._0_8_);
      }
    }
  }
  return bVar2;
}

Assistant:

bool Checker::check_prediction_param(HyperParam& hyper_param) {
 bool bo = true;
 /*********************************************************
  *  Check the path of test set file                      *
  *********************************************************/
 if (hyper_param.from_file) {
  if (!FileExist(hyper_param.test_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Test set file: %s does not exist.",
            hyper_param.test_set_file.c_str())
      );
      bo =  false;
  }
 } else {
   if (hyper_param.test_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Test dataset is None, please check!")
      );
      bo =  false;
   }
 }
 /*********************************************************
  *  Check the path of model file                         *
  *********************************************************/
 if (!FileExist(hyper_param.model_file.c_str())) {
    Color::print_error(
      StringPrintf("Model file: %s does not exist.",
           hyper_param.model_file.c_str())
    );
    bo = false;
 }
 /*********************************************************
  *  Check invalid value                                  *
  *********************************************************/
 if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
 if (!bo) return false;
 /*********************************************************
  *  Check warning and fix conflict                       *
  *********************************************************/
 check_conflict_predict(hyper_param);
 /*********************************************************
  *  Set default value                                    *
  *********************************************************/
 if (hyper_param.res_out) {
  if (hyper_param.output_file.empty()) {
    hyper_param.output_file = hyper_param.test_set_file + ".out";
  }
 }

 return true;
}